

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O2

int KINSetResMonParams(void *kinmem,realtype omegamin,realtype omegamax)

{
  double dVar1;
  int error_code;
  char *msgfmt;
  
  if (kinmem == (void *)0x0) {
    msgfmt = "kinsol_mem = NULL illegal.";
    error_code = -1;
  }
  else {
    if (0.0 <= omegamin) {
      dVar1 = (double)(~-(ulong)(omegamin == 0.0) & (ulong)omegamin |
                      -(ulong)(omegamin == 0.0) & 0x3ee4f8b588e368f1);
      *(double *)((long)kinmem + 0x238) = dVar1;
      if (0.0 <= omegamax) {
        if ((omegamax != 0.0) || (NAN(omegamax))) {
          if (dVar1 <= omegamax) {
            *(realtype *)((long)kinmem + 0x240) = omegamax;
            return 0;
          }
        }
        else if (dVar1 <= 0.9) {
          *(undefined8 *)((long)kinmem + 0x240) = 0x3feccccccccccccd;
          return 0;
        }
      }
    }
    msgfmt = "scalars < 0 illegal.";
    error_code = -2;
  }
  KINProcessError((KINMem)0x0,error_code,"KINSOL","KINSetResMonParams",msgfmt);
  return error_code;
}

Assistant:

int KINSetResMonParams(void *kinmem, realtype omegamin, realtype omegamax)
{
  KINMem kin_mem;

  if (kinmem == NULL) {
    KINProcessError(NULL, KIN_MEM_NULL, "KINSOL", "KINSetResMonParams", MSG_NO_MEM);
    return(KIN_MEM_NULL);
  }

  kin_mem = (KINMem) kinmem;

  /* check omegamin */

  if (omegamin < ZERO) {
    KINProcessError(NULL, KIN_ILL_INPUT, "KINSOL", "KINSetResMonParams", MSG_BAD_OMEGA);
    return(KIN_ILL_INPUT);
  }

  if (omegamin == ZERO) 
    kin_mem->kin_omega_min = OMEGA_MIN;
  else
    kin_mem->kin_omega_min = omegamin;

  /* check omegamax */

  if (omegamax < ZERO) {
    KINProcessError(NULL, KIN_ILL_INPUT, "KINSOL", "KINSetResMonParams", MSG_BAD_OMEGA);
    return(KIN_ILL_INPUT);
  }

  if (omegamax == ZERO) {

    if (kin_mem->kin_omega_min > OMEGA_MAX) {
      KINProcessError(NULL, KIN_ILL_INPUT, "KINSOL", "KINSetResMonParams", MSG_BAD_OMEGA);
      return(KIN_ILL_INPUT);
    }
    else kin_mem->kin_omega_max = OMEGA_MAX;

  } else {

    if (kin_mem->kin_omega_min > omegamax) {
      KINProcessError(NULL, KIN_ILL_INPUT, "KINSOL", "KINSetResMonParams", MSG_BAD_OMEGA);
      return(KIN_ILL_INPUT);
    }
    else kin_mem->kin_omega_max = omegamax;

  }

  return(KIN_SUCCESS);
}